

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
          (SupportedTextureType *this,RenderContext *context,GLuint resultTextureId,IVec2 *size,
          GLint reductionMode)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int *piVar4;
  undefined4 *puVar5;
  undefined4 local_3c;
  long lStack_38;
  GLuint fbo;
  Functions *gl;
  IVec2 *pIStack_28;
  GLint reductionMode_local;
  IVec2 *size_local;
  RenderContext *pRStack_18;
  GLuint resultTextureId_local;
  RenderContext *context_local;
  SupportedTextureType *this_local;
  
  gl._4_4_ = reductionMode;
  pIStack_28 = size;
  size_local._4_4_ = resultTextureId;
  pRStack_18 = context;
  context_local = (RenderContext *)this;
  iVar2 = (*context->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lStack_38 + 0xb8))(0xde1,size_local._4_4_);
  dVar3 = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(dVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x88);
  pcVar1 = *(code **)(lStack_38 + 0x1380);
  piVar4 = tcu::Vector<int,_2>::x(size);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(size);
  (*pcVar1)(0xde1,1,0x8058,iVar2,*piVar4);
  dVar3 = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(dVar3,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x8b);
  local_3c = 0;
  (**(code **)(lStack_38 + 0x6d0))(1,&local_3c);
  dVar3 = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(dVar3,"genFramebuffers error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x8f);
  (**(code **)(lStack_38 + 0x78))(0x8d40,local_3c);
  dVar3 = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(dVar3,"bindFramebuffer error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x92);
  (**(code **)(lStack_38 + 0x6a0))(0x8d40,0x8ce0,0xde1,size_local._4_4_,0);
  dVar3 = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(dVar3,"framebufferTexture2D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x95);
  iVar2 = (**(code **)(lStack_38 + 0x170))(0x8d40);
  if (iVar2 != 0x8cd5) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  pcVar1 = *(code **)(lStack_38 + 0x1a00);
  piVar4 = tcu::Vector<int,_2>::x(size);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(size);
  (*pcVar1)(0,0,iVar2,*piVar4);
  renderQuad(this,pRStack_18,gl._4_4_);
  (**(code **)(lStack_38 + 0x440))(1,&local_3c);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO(const glu::RenderContext& context,
																 glw::GLuint resultTextureId, tcu::IVec2 size,
																 glw::GLint reductionMode)
{
	const glw::Functions& gl = context.getFunctions();

	gl.bindTexture(GL_TEXTURE_2D, resultTextureId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, size.x(), size.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	glw::GLuint fbo = 0;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "genFramebuffers error occurred");

	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindFramebuffer error occurred");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, resultTextureId, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "framebufferTexture2D error occurred");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, size.x(), size.y());
	renderQuad(context, reductionMode);

	gl.deleteFramebuffers(1, &fbo);
}